

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O1

void readvalue(uint8 *base,uint32 typeoffset,uint32 valoffset,MOJOSHADER_effectValue *value,
              MOJOSHADER_effectObject *objects,MOJOSHADER_malloc m,void *d)

{
  uint *puVar1;
  MOJOSHADER_symbolType MVar2;
  MOJOSHADER_symbolClass MVar3;
  MOJOSHADER_effectSamplerState *pMVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  void *pvVar8;
  MOJOSHADER_symbolStructMember *pMVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint32 *ptr;
  uint *puVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  long lVar21;
  
  uVar10 = (ulong)typeoffset;
  MVar2 = *(MOJOSHADER_symbolType *)(base + uVar10);
  MVar3 = *(MOJOSHADER_symbolClass *)(base + uVar10 + 4);
  uVar18 = *(uint *)(base + uVar10 + 8);
  uVar13 = *(uint *)(base + uVar10 + 0xc);
  uVar19 = *(uint *)(base + uVar10 + 0x10);
  (value->type).parameter_type = MVar2;
  (value->type).parameter_class = MVar3;
  uVar14 = *(uint *)(base + uVar18);
  if ((ulong)uVar14 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)(*m)(uVar14,d);
    memcpy(pcVar7,base + (ulong)uVar18 + 4,(ulong)uVar14);
  }
  value->name = pcVar7;
  uVar18 = *(uint *)(base + uVar13);
  if ((ulong)uVar18 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)(*m)(uVar18,d);
    memcpy(pcVar7,base + (ulong)uVar13 + 4,(ulong)uVar18);
  }
  value->semantic = pcVar7;
  (value->type).elements = uVar19;
  if (MOJOSHADER_SYMCLASS_STRUCT < MVar3) {
    __assert_fail("valclass >= MOJOSHADER_SYMCLASS_SCALAR && valclass <= MOJOSHADER_SYMCLASS_STRUCT"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                  ,0x10f,
                  "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                 );
  }
  puVar17 = (uint *)(base + valoffset);
  if (MVar3 < MOJOSHADER_SYMCLASS_OBJECT) {
    if (2 < MVar2 - MOJOSHADER_SYMTYPE_BOOL) {
      __assert_fail("type >= MOJOSHADER_SYMTYPE_BOOL && type <= MOJOSHADER_SYMTYPE_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x117,
                    "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                   );
    }
    uVar18 = *(uint *)(base + uVar10 + 0x14);
    uVar13 = *(uint *)(base + uVar10 + 0x18);
    (value->type).columns = uVar18;
    (value->type).rows = uVar13;
    uVar13 = (uVar19 + (uVar19 == 0)) * uVar13;
    value->value_count = uVar13 * 4;
    pvVar8 = (*m)(uVar13 * 0x10,d);
    (value->field_4).values = pvVar8;
    uVar10 = 0;
    memset(pvVar8,0,(ulong)(uVar13 * 0x10));
    if ((uVar13 & 0xfffffff) != 0) {
      uVar18 = uVar18 * 4;
      uVar20 = 0;
      do {
        memcpy((void *)((long)(value->field_4).values + uVar20),(void *)(uVar10 + (long)puVar17),
               (ulong)uVar18);
        uVar20 = uVar20 + 0x10;
        uVar10 = (ulong)((int)uVar10 + uVar18);
      } while (((uVar13 & 0xfffffff) + (uint)((uVar13 & 0xfffffff) == 0)) * 0x10 != uVar20);
    }
  }
  else if (MVar3 == MOJOSHADER_SYMCLASS_OBJECT) {
    if (0xc < MVar2 - MOJOSHADER_SYMTYPE_STRING) {
      __assert_fail("type >= MOJOSHADER_SYMTYPE_STRING && type <= MOJOSHADER_SYMTYPE_VERTEXSHADER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                    ,0x12d,
                    "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                   );
    }
    if (((MVar2 == MOJOSHADER_SYMTYPE_SAMPLERCUBE) ||
        ((MVar2 & (MOJOSHADER_SYMTYPE_VERTEXSHADER|MOJOSHADER_SYMTYPE_SAMPLERCUBE)) ==
         MOJOSHADER_SYMTYPE_SAMPLER2D)) ||
       ((MVar2 & (MOJOSHADER_SYMTYPE_VERTEXSHADER|MOJOSHADER_SYMTYPE_SAMPLERCUBE)) ==
        MOJOSHADER_SYMTYPE_SAMPLER)) {
      uVar18 = *puVar17;
      value->value_count = uVar18;
      pvVar8 = (*m)(uVar18 * 0x48,d);
      (value->field_4).values = pvVar8;
      memset(pvVar8,0,(ulong)(uVar18 * 0x48));
      if ((ulong)uVar18 != 0) {
        puVar17 = puVar17 + 1;
        uVar13 = 0x98967b;
        lVar21 = 0;
        do {
          if (uVar13 < 4) {
            uVar19 = 0;
            uVar14 = 0;
          }
          else {
            uVar19 = uVar13 - 4;
            uVar14 = *puVar17 & 0xffffff5f;
            puVar17 = puVar17 + 1;
          }
          uVar13 = 0;
          uVar5 = uVar19 - 4;
          puVar17 = puVar17 + (3 < uVar19);
          if (3 >= uVar19) {
            uVar5 = 0;
          }
          if (uVar5 < 4) {
            uVar5 = 0;
            uVar19 = 0;
          }
          else {
            uVar19 = *puVar17;
            puVar17 = puVar17 + 1;
            uVar5 = uVar5 - 4;
          }
          if (uVar5 < 4) {
            uVar12 = 0;
          }
          else {
            uVar12 = *puVar17;
            puVar17 = puVar17 + 1;
            uVar13 = uVar5 - 4;
          }
          pMVar4 = (value->field_4).valuesSS;
          puVar1 = (uint *)((long)&pMVar4->type + lVar21);
          *puVar1 = uVar14;
          readvalue(base,uVar19,uVar12,(MOJOSHADER_effectValue *)(puVar1 + 2),objects,m,d);
          if (uVar14 == 4) {
            objects[**(int **)((long)&(pMVar4->value).field_4 + lVar21)].type = MVar2;
          }
          lVar21 = lVar21 + 0x48;
        } while ((ulong)uVar18 * 0x48 != lVar21);
      }
    }
    else {
      uVar19 = uVar19 + (uVar19 == 0);
      value->value_count = uVar19;
      uVar19 = uVar19 * 4;
      pvVar8 = (*m)(uVar19,d);
      (value->field_4).values = pvVar8;
      memcpy(pvVar8,puVar17,(ulong)uVar19);
      if (value->value_count != 0) {
        uVar10 = 0;
        do {
          objects[*(int *)((long)(value->field_4).values + uVar10 * 4)].type = MVar2;
          uVar10 = uVar10 + 1;
        } while (uVar10 < value->value_count);
      }
    }
  }
  else {
    uVar18 = *(uint *)(base + uVar10 + 0x14);
    puVar17 = (uint *)(base + uVar10 + 0x18);
    (value->type).member_count = uVar18;
    pMVar9 = (MOJOSHADER_symbolStructMember *)(*m)(uVar18 * 0x28,d);
    (value->type).members = pMVar9;
    iVar11 = 0;
    if ((value->type).member_count == 0) {
      uVar18 = 0;
    }
    else {
      uVar13 = 0x989667;
      lVar21 = 0x20;
      uVar10 = 0;
      uVar18 = 0;
      do {
        if (uVar13 < 4) {
          uVar13 = 0;
          uVar14 = 0;
        }
        else {
          uVar14 = *puVar17;
          puVar17 = puVar17 + 1;
          uVar13 = uVar13 - 4;
        }
        pMVar9 = (value->type).members;
        *(uint *)((long)pMVar9 + lVar21 + -0x14) = uVar14;
        uVar14 = 0;
        if (uVar13 < 4) {
          uVar13 = 0;
          uVar5 = 0;
        }
        else {
          uVar5 = *puVar17;
          puVar17 = puVar17 + 1;
          uVar13 = uVar13 - 4;
        }
        *(uint *)((long)pMVar9 + lVar21 + -0x18) = uVar5;
        if (uVar13 < 4) {
          uVar20 = 0;
        }
        else {
          uVar20 = (ulong)*puVar17;
          puVar17 = puVar17 + 1;
          uVar14 = uVar13 - 4;
        }
        uVar13 = uVar14 - 4;
        if (3 >= uVar14) {
          uVar13 = 0;
        }
        uVar5 = *(uint *)(base + uVar20);
        if ((ulong)uVar5 == 0) {
          pvVar8 = (void *)0x0;
        }
        else {
          pvVar8 = (*m)(uVar5,d);
          memcpy(pvVar8,base + uVar20 + 4,(ulong)uVar5);
        }
        puVar17 = puVar17 + (3 < uVar14);
        *(void **)((long)pMVar9 + lVar21 + -0x20) = pvVar8;
        uVar14 = 0;
        if (uVar13 < 4) {
          uVar13 = 0;
          uVar5 = 0;
        }
        else {
          uVar5 = *puVar17;
          puVar17 = puVar17 + 1;
          uVar13 = uVar13 - 4;
        }
        *(uint *)((long)pMVar9 + lVar21 + -8) = uVar5;
        if (uVar13 < 4) {
          uVar12 = 0;
        }
        else {
          uVar12 = *puVar17;
          puVar17 = puVar17 + 1;
          uVar14 = uVar13 - 4;
        }
        *(uint *)((long)pMVar9 + lVar21 + -0xc) = uVar12;
        uVar13 = 0;
        if (uVar14 < 4) {
          uVar12 = 0;
        }
        else {
          uVar12 = *puVar17;
          puVar17 = puVar17 + 1;
          uVar13 = uVar14 - 4;
        }
        *(uint *)((long)pMVar9 + lVar21 + -0x10) = uVar12;
        if (1 < *(uint *)((long)pMVar9 + lVar21 + -0x18)) {
          __assert_fail("mem->info.parameter_class >= MOJOSHADER_SYMCLASS_SCALAR && mem->info.parameter_class <= MOJOSHADER_SYMCLASS_VECTOR"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0x178,
                        "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                       );
        }
        if (2 < *(int *)((long)pMVar9 + lVar21 + -0x14) - 1U) {
          __assert_fail("mem->info.parameter_type >= MOJOSHADER_SYMTYPE_BOOL && mem->info.parameter_type <= MOJOSHADER_SYMTYPE_FLOAT"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                        ,0x17a,
                        "void readvalue(const uint8 *, const uint32, const uint32, MOJOSHADER_effectValue *, MOJOSHADER_effectObject *, MOJOSHADER_malloc, void *)"
                       );
        }
        *(undefined4 *)((long)pMVar9 + lVar21 + -4) = 0;
        *(undefined8 *)((long)&pMVar9->name + lVar21) = 0;
        uVar18 = uVar18 + (uVar5 + (uVar5 == 0)) * uVar12 * 4;
        uVar10 = uVar10 + 1;
        lVar21 = lVar21 + 0x28;
      } while (uVar10 < (value->type).member_count);
    }
    (value->type).columns = uVar18;
    iVar15 = uVar19 + (uVar19 == 0);
    (value->type).rows = 1;
    uVar18 = uVar18 * iVar15;
    value->value_count = uVar18;
    uVar18 = uVar18 * 4;
    pvVar8 = (*m)(uVar18,d);
    (value->field_4).values = pvVar8;
    memset(pvVar8,0,(ulong)uVar18);
    lVar21 = 0;
    iVar6 = 0;
    do {
      if ((value->type).member_count != 0) {
        uVar10 = 0;
        do {
          pMVar9 = (value->type).members;
          iVar16 = pMVar9[uVar10].info.elements * pMVar9[uVar10].info.rows;
          if (iVar16 != 0) {
            lVar21 = (long)(int)lVar21;
            do {
              memcpy((void *)(lVar21 * 4 + (long)(value->field_4).values),
                     (void *)((long)puVar17 + (long)iVar6),
                     (ulong)((value->type).members[uVar10].info.columns << 2));
              lVar21 = lVar21 + 4;
              iVar6 = iVar6 + (value->type).members[uVar10].info.columns * 4;
              iVar16 = iVar16 + -1;
            } while (iVar16 != 0);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < (value->type).member_count);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar15);
  }
  return;
}

Assistant:

static void readvalue(const uint8 *base,
                      const uint32 typeoffset,
                      const uint32 valoffset,
                      MOJOSHADER_effectValue *value,
                      MOJOSHADER_effectObject *objects,
                      MOJOSHADER_malloc m,
                      void *d)
{
    int i, j, k;
    const uint8 *typeptr = base + typeoffset;
    const uint8 *valptr = base + valoffset;
    unsigned int typelen = 9999999;  // !!! FIXME
    const uint32 type = readui32(&typeptr, &typelen);
    const uint32 valclass = readui32(&typeptr, &typelen);
    const uint32 name = readui32(&typeptr, &typelen);
    const uint32 semantic = readui32(&typeptr, &typelen);
    const uint32 numelements = readui32(&typeptr, &typelen);

    value->type.parameter_type = (MOJOSHADER_symbolType) type;
    value->type.parameter_class = (MOJOSHADER_symbolClass) valclass;
    value->name = readstring(base, name, m, d);
    value->semantic = readstring(base, semantic, m, d);
    value->type.elements = numelements;

    /* Class sanity check */
    assert(valclass >= MOJOSHADER_SYMCLASS_SCALAR && valclass <= MOJOSHADER_SYMCLASS_STRUCT);

    if (valclass == MOJOSHADER_SYMCLASS_SCALAR
     || valclass == MOJOSHADER_SYMCLASS_VECTOR
     || valclass == MOJOSHADER_SYMCLASS_MATRIX_ROWS
     || valclass == MOJOSHADER_SYMCLASS_MATRIX_COLUMNS)
    {
        /* These classes only ever contain scalar values */
        assert(type >= MOJOSHADER_SYMTYPE_BOOL && type <= MOJOSHADER_SYMTYPE_FLOAT);

        const uint32 columncount = readui32(&typeptr, &typelen);
        const uint32 rowcount = readui32(&typeptr, &typelen);

        value->type.columns = columncount;
        value->type.rows = rowcount;

        uint32 siz = 4 * rowcount;
        if (numelements > 0)
            siz *= numelements;
        value->value_count = siz;
        siz *= 4;
        value->values = m(siz, d);
        memset(value->values, '\0', siz);
        siz /= 16;
        for (i = 0; i < siz; i++)
            memcpy(value->valuesF + (i << 2), valptr + ((columncount << 2) * i), columncount << 2);
    } // if
    else if (valclass == MOJOSHADER_SYMCLASS_OBJECT)
    {
        /* This class contains either samplers or "objects" */
        assert(type >= MOJOSHADER_SYMTYPE_STRING && type <= MOJOSHADER_SYMTYPE_VERTEXSHADER);

        if (type == MOJOSHADER_SYMTYPE_SAMPLER
         || type == MOJOSHADER_SYMTYPE_SAMPLER1D
         || type == MOJOSHADER_SYMTYPE_SAMPLER2D
         || type == MOJOSHADER_SYMTYPE_SAMPLER3D
         || type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            unsigned int vallen = 9999999; // !!! FIXME
            const uint32 numstates = readui32(&valptr, &vallen);

            value->value_count = numstates;

            const uint32 siz = sizeof(MOJOSHADER_effectSamplerState) * numstates;
            value->values = m(siz, d);
            memset(value->values, '\0', siz);

            for (i = 0; i < numstates; i++)
            {
                MOJOSHADER_effectSamplerState *state = &value->valuesSS[i];
                const uint32 stype = readui32(&valptr, &vallen) & ~0xA0;
                /*const uint32 FIXME =*/ readui32(&valptr, &vallen);
                const uint32 statetypeoffset = readui32(&valptr, &vallen);
                const uint32 statevaloffset = readui32(&valptr, &vallen);

                state->type = (MOJOSHADER_samplerStateType) stype;
                readvalue(base, statetypeoffset, statevaloffset,
                          &state->value, objects,
                          m, d);
                if (stype == MOJOSHADER_SAMP_TEXTURE)
                    objects[state->value.valuesI[0]].type = (MOJOSHADER_symbolType) type;
            } // for
        } // if
        else
        {
            uint32 numobjects = 1;
            if (numelements > 0)
                numobjects = numelements;

            value->value_count = numobjects;

            const uint32 siz = 4 * numobjects;
            value->values = m(siz, d);
            memcpy(value->values, valptr, siz);

            for (i = 0; i < value->value_count; i++)
                objects[value->valuesI[i]].type = (MOJOSHADER_symbolType) type;
        } // else
    } // else if
    else if (valclass == MOJOSHADER_SYMCLASS_STRUCT)
    {
        uint32 siz;

        value->type.member_count = readui32(&typeptr, &typelen);
        siz = value->type.member_count * sizeof (MOJOSHADER_symbolStructMember);
        value->type.members = (MOJOSHADER_symbolStructMember *) m(siz, d);

        uint32 structsize = 0;
        for (i = 0; i < value->type.member_count; i++)
        {
            MOJOSHADER_symbolStructMember *mem = &value->type.members[i];

            mem->info.parameter_type = (MOJOSHADER_symbolType) readui32(&typeptr, &typelen);
            mem->info.parameter_class = (MOJOSHADER_symbolClass) readui32(&typeptr, &typelen);

            const uint32 memname = readui32(&typeptr, &typelen);
            /*const uint32 memsemantic =*/ readui32(&typeptr, &typelen);
            mem->name = readstring(base, memname, m, d);

            mem->info.elements = readui32(&typeptr, &typelen);
            mem->info.columns = readui32(&typeptr, &typelen);
            mem->info.rows = readui32(&typeptr, &typelen);

            // !!! FIXME: Nested structs! -flibit
            assert(mem->info.parameter_class >= MOJOSHADER_SYMCLASS_SCALAR
                && mem->info.parameter_class <= MOJOSHADER_SYMCLASS_VECTOR);
            assert(mem->info.parameter_type >= MOJOSHADER_SYMTYPE_BOOL
                && mem->info.parameter_type <= MOJOSHADER_SYMTYPE_FLOAT);
            mem->info.member_count = 0;
            mem->info.members = NULL;

            uint32 memsize = 4 * mem->info.rows;
            if (mem->info.elements > 0)
                memsize *= mem->info.elements;
            structsize += memsize;
        } // for

        value->type.columns = structsize;
        value->type.rows = 1;
        value->value_count = structsize;
        if (numelements > 0)
            value->value_count *= numelements;

        siz = value->value_count * 4;
        value->values = m(siz, d);
        memset(value->values, '\0', siz);
        int dst_offset = 0, src_offset = 0;
        i = 0;
        do
        {
            for (j = 0; j < value->type.member_count; j++)
            {
                siz = value->type.members[j].info.rows * value->type.members[j].info.elements;
                for (k = 0; k < siz; k++)
                {
                    memcpy(value->valuesF + dst_offset,
                           typeptr + src_offset, /* Yes, typeptr. -flibit */
                           value->type.members[j].info.columns << 2);
                    dst_offset += 4;
                    src_offset += value->type.members[j].info.columns << 2;
                } // for
            }
        } while (++i < numelements);
    } // else if
}